

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateFunctionAccess(ExpressionEvalContext *ctx,ExprFunctionAccess *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  TypeFunction *pTVar5;
  int iVar6;
  undefined4 extraout_var;
  ExprBase *pEVar7;
  ExprBase *value;
  FunctionData *pFVar8;
  undefined4 extraout_var_00;
  
  uVar1 = (ctx->stackFrames).count;
  if ((uVar1 == 0) || ((ctx->stackFrames).data[uVar1 - 1]->targetYield == 0)) {
    if (ctx->instruction < ctx->instructionsLimit) {
      ctx->instruction = ctx->instruction + 1;
      pEVar7 = Evaluate(ctx,expression->context);
      if (pEVar7 != (ExprBase *)0x0) {
        pFVar8 = expression->function->implementation;
        if (pFVar8 == (FunctionData *)0x0) {
          pFVar8 = expression->function;
        }
        pAVar2 = ctx->ctx->allocator;
        iVar6 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x40);
        value = (ExprBase *)CONCAT44(extraout_var_00,iVar6);
        pSVar3 = (expression->super_ExprBase).source;
        pTVar5 = pFVar8->type;
        value->typeID = 0xb;
        value->source = pSVar3;
        value->type = &pTVar5->super_TypeBase;
        value->next = (ExprBase *)0x0;
        value->listed = false;
        value->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e8740;
        value[1]._vptr_ExprBase = (_func_int **)pFVar8;
        *(ExprBase **)&value[1].typeID = pEVar7;
        pEVar7 = CheckType(&expression->super_ExprBase,value);
        return pEVar7;
      }
      pEVar7 = (ExprBase *)0x0;
    }
    else {
      pEVar7 = (ExprBase *)0x0;
      Report(ctx,"ERROR: instruction limit reached");
    }
  }
  else {
    pAVar2 = ctx->ctx->allocator;
    iVar6 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar6);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeVoid;
    pEVar7->typeID = 2;
    pEVar7->source = pSVar3;
    pEVar7->type = pTVar4;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6b38;
  }
  return pEVar7;
}

Assistant:

ExprBase* EvaluateFunctionAccess(ExpressionEvalContext &ctx, ExprFunctionAccess *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *context = Evaluate(ctx, expression->context);

	if(!context)
		return NULL;

	FunctionData *function = expression->function;

	if(function->implementation)
		function = function->implementation;

	return CheckType(expression, new (ctx.ctx.get<ExprFunctionLiteral>()) ExprFunctionLiteral(expression->source, function->type, function, context));
}